

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Primitive.cpp
# Opt level: O1

void __thiscall Primitive::input(Primitive *this,string *var,stringstream *fin)

{
  int iVar1;
  string file;
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88 [16];
  string local_78 [96];
  
  iVar1 = std::__cxx11::string::compare((char *)var);
  if (iVar1 == 0) {
    operator>>(fin,&this->color);
  }
  iVar1 = std::__cxx11::string::compare((char *)var);
  if (iVar1 == 0) {
    operator>>(fin,&this->absor);
  }
  iVar1 = std::__cxx11::string::compare((char *)var);
  if (iVar1 == 0) {
    std::istream::_M_extract<double>((double *)fin);
  }
  iVar1 = std::__cxx11::string::compare((char *)var);
  if (iVar1 == 0) {
    std::istream::_M_extract<double>((double *)fin);
  }
  iVar1 = std::__cxx11::string::compare((char *)var);
  if (iVar1 == 0) {
    std::istream::_M_extract<double>((double *)fin);
  }
  iVar1 = std::__cxx11::string::compare((char *)var);
  if (iVar1 == 0) {
    std::istream::_M_extract<double>((double *)fin);
  }
  iVar1 = std::__cxx11::string::compare((char *)var);
  if (iVar1 == 0) {
    std::istream::_M_extract<double>((double *)fin);
  }
  iVar1 = std::__cxx11::string::compare((char *)var);
  if (iVar1 == 0) {
    local_90 = 0;
    local_88[0] = 0;
    local_98 = local_88;
    std::operator>>((istream *)fin,(string *)&local_98);
    cv::imread(local_78,(int)&local_98);
    Picture::operator=(&this->texture,(Mat *)local_78);
    cv::Mat::~Mat((Mat *)local_78);
    if ((this->texture).data == (Vec3b *)0x0) {
      __assert_fail("texture.data != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lazycal[P]Progressive-Photon-Mapping/Primitive.cpp"
                    ,0x12,"virtual void Primitive::input(const std::string &, std::stringstream &)")
      ;
    }
    if (local_98 != local_88) {
      operator_delete(local_98);
    }
  }
  return;
}

Assistant:

void Primitive::input(const std::string &var, std::stringstream &fin) {
    if ( var == "color=" ) fin >> color;
    if ( var == "absor=" ) fin >> absor;
    if ( var == "refl=" ) fin >> refl;
    if ( var == "refr=" ) fin >> refr;
    if ( var == "diff=" ) fin >> diff;
    if ( var == "spec=" ) fin >> spec;
    if ( var == "rindex=" ) fin >> rindex;
    if ( var == "texture=" ) {
        std::string file; fin >> file;
        texture = imread(file);
        assert(texture.data != NULL);
    }
}